

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu.cpp
# Opt level: O1

oraddr_t __thiscall IMMU::immu_translate(IMMU *this,oraddr_t virtaddr)

{
  CPU *pCVar1;
  uorreg_t *puVar2;
  int iVar3;
  uint uVar4;
  uint *local_20;
  
  pCVar1 = (this->super_MMU).cpu;
  if (((pCVar1->sprs[0x11] & 0x40) == 0) || ((pCVar1->sprs[1] & 0x10) == 0)) {
    this->insn_ci = virtaddr >> 0x1f;
  }
  else {
    puVar2 = immu_find_tlbmr(this,virtaddr,&local_20);
    if (puVar2 == (uorreg_t *)0x0) {
      virtaddr = 0;
    }
    else {
      if (0 < (this->super_MMU).nways) {
        iVar3 = 0;
        do {
          uVar4 = *local_20 & 0xc0;
          if (uVar4 != 0) {
            *local_20 = uVar4 - 0x40 | *local_20 & 0xffffff3f;
          }
          iVar3 = iVar3 + 1;
          local_20 = local_20 + 0x100;
        } while (iVar3 < (this->super_MMU).nways);
      }
      *puVar2 = *puVar2 | (this->super_MMU).lru_reload;
      this->insn_ci = puVar2[0x80] & 2;
      virtaddr = virtaddr & (this->super_MMU).page_offset_mask | puVar2[0x80] & 0xffffe000;
    }
  }
  return virtaddr;
}

Assistant:

oraddr_t IMMU::immu_translate(oraddr_t virtaddr)
{
    int i;
    uorreg_t *itlbtr;
    uorreg_t *itlbmr;
    uorreg_t *itlbmr_lru;

    //disable mmu
    if (!(cpu->sprs[SPR_SR] & SPR_SR_IME) ||
        !(cpu->sprs[SPR_UPR] & SPR_UPR_IMP))
    {
        insn_ci = (virtaddr >= 0x80000000);
        return virtaddr;
    }

    itlbmr = immu_find_tlbmr(virtaddr, &itlbmr_lru);

    if (itlbmr)
    {
        itlbtr = itlbmr + 128;

        /* Set LRUs */
        /*
         * every itlbmr have distance of 256.
         * every itlbmr have 128 in maximum.
        */
        for (i = 0; i < nways; i++, itlbmr_lru += (128 * 2))
        {
            //LRU 7-6
            if (*itlbmr_lru & SPR_ITLBMR_LRU)
                *itlbmr_lru = (*itlbmr_lru & ~SPR_ITLBMR_LRU) |
                              ((*itlbmr_lru & SPR_ITLBMR_LRU) - 0x40);
        }

        *itlbmr |= lru_reload;

        /* Check if page is cache inhibited */
        insn_ci = *itlbtr & SPR_ITLBTR_CI;

        //itlbtr's PPM + (virtaddr & page_offset_mask)
        return (*itlbtr & SPR_ITLBTR_PPN) | (virtaddr & page_offset_mask);
    }

    //TODO:
    //except_handle(EXCEPT_ITLBMISS, virtaddr);

    return 0;
}